

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.hpp
# Opt level: O3

Oop __thiscall Lodtalk::MethodDictionary::internalAtOrNil(MethodDictionary *this,Oop key)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar6;
  
  uVar1 = *(ulong *)(this + 8);
  if ((uVar1 & 1) == 0) {
    __assert_fail("isSmallInteger()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                  ,0x200,"SmallIntegerValue Lodtalk::Oop::decodeSmallInteger() const");
  }
  if (1 < uVar1) {
    if (((ulong)key.field_0 & 1) == 0) {
      uVar3 = key.field_0._0_4_ & 6;
      if ((uVar3 == 4) || (uVar3 == 2)) {
        uVar3 = (uint)((ulong)key.field_0 >> 3);
      }
      else {
        uVar3 = *(uint *)key.field_0 >> 10;
      }
    }
    else {
      uVar3 = (uint)((ulong)key.field_0 >> 1);
    }
    uVar4 = (ulong)(long)(int)uVar3 % (ulong)((long)uVar1 >> 1);
    lVar2 = *(long *)(this + 0x18);
    uVar5 = uVar4;
    if (lVar2 == 0) {
      __assert_fail("keyValues",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                    ,0xc1,"Oop *Lodtalk::HashedCollection::getHashTableKeyValues() const");
    }
    do {
      aVar6 = (anon_union_8_4_0eb573b0_for_Oop_0)
              ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar2 + 8 + uVar5 * 8))->pointer;
      if ((aVar6.pointer == (uint8_t *)&NilObject) ||
         ((anon_union_8_4_0eb573b0_for_Oop_0)aVar6.pointer == key.field_0)) goto LAB_001354f5;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)uVar1 >> 1));
    if (uVar4 != 0) {
      uVar5 = 0;
      do {
        aVar6 = (anon_union_8_4_0eb573b0_for_Oop_0)
                ((anon_union_8_4_0eb573b0_for_Oop_0 *)(lVar2 + 8 + uVar5 * 8))->pointer;
        if ((aVar6.pointer == (uint8_t *)&NilObject) ||
           ((anon_union_8_4_0eb573b0_for_Oop_0)aVar6.pointer == key.field_0)) {
LAB_001354f5:
          if ((long)uVar5 < 0) {
            return (Oop)&NilObject;
          }
          if (aVar6.pointer != (uint8_t *)&NilObject) {
            if (*(long *)(this + 0x20) == 0) {
              __assert_fail("values",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Collections.hpp"
                            ,0x172,"Oop *Lodtalk::MethodDictionary::getHashTableValues() const");
            }
            return (Oop)((anon_union_8_4_0eb573b0_for_Oop_0 *)
                        (*(long *)(this + 0x20) + 8 + uVar5 * 8))->pointer;
          }
          return (Oop)&NilObject;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar4);
    }
  }
  return (Oop)&NilObject;
}

Assistant:

Oop internalAtOrNil(Oop key)
	{
		// If a slot was not found, try to increase the capacity.
		auto position = findKeyPosition(key, identityFunction<Oop>, identityHashOf, identityOopEquals);
		if(position < 0)
			return nilOop();

		auto oldKey = getHashTableKeys()[position];
		if(isNil(oldKey))
			return nilOop();
		return getHashTableValues()[position];
	}